

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall SVGChart::PPlot::DrawYAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  long lVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float extraout_XMM0_Da;
  bool theIsMajorTick;
  float theY;
  string theLabel;
  string theFormatString;
  PRect theTickRect;
  byte local_b9;
  float local_b8;
  undefined4 local_b4;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long local_70;
  long local_68;
  PStyle *local_60;
  ulong local_58 [5];
  
  local_60 = &(this->mYAxisSetup).mStyle;
  (*inPainter->_vptr_Painter[0xc])(inPainter);
  lVar5 = inRect->mH;
  fVar7 = 0.0;
  if ((this->mYAxisSetup).mCrossOrigin == false) {
    if ((this->mXAxisSetup).mAscending == true) {
      fVar7 = (this->mXAxisSetup).mMin;
    }
    else {
      fVar7 = (this->mXAxisSetup).mMax;
    }
  }
  uVar6 = inRect->mX;
  lVar1 = inRect->mY;
  (*this->mXTrafo->_vptr_Trafo[2])(fVar7);
  local_b8 = extraout_XMM0_Da;
  (**inPainter->_vptr_Painter)(inPainter);
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mTickInfo.mStyle);
  iVar3 = (*this->mYTickIterator->_vptr_TickIterator[2])();
  if ((char)iVar3 == '\0') {
    bVar4 = false;
  }
  else {
    local_90 = &local_80;
    local_88 = 0;
    local_80 = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_68 = lVar1;
    if ((this->mYAxisSetup).mTickInfo.mTicksOn == true) {
      local_70 = lVar5;
      while (iVar3 = (*this->mYTickIterator->_vptr_TickIterator[3])
                               (this->mYTickIterator,&local_b4,&local_b9,&local_90),
            lVar5 = local_70, (char)iVar3 != '\0') {
        iVar3 = (*(this->super_PDrawer)._vptr_PDrawer[0xd])
                          (local_b4,this,(ulong)(uint)(int)local_b8,(ulong)local_b9,&local_90,
                           inPainter,local_58);
        if ((char)iVar3 == '\0') {
          bVar4 = false;
          goto LAB_00106acd;
        }
        if ((long)local_58[0] < (long)uVar6) {
          uVar6 = local_58[0];
        }
      }
    }
    (*inPainter->_vptr_Painter[0xc])(inPainter,local_60);
    pcVar2 = (this->mYAxisSetup).mLabel._M_dataplus._M_p;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (this->mYAxisSetup).mLabel._M_string_length);
    if (local_a8 != 0) {
      iVar3 = (*inPainter->_vptr_Painter[8])(inPainter,local_b0);
      (*inPainter->_vptr_Painter[0xb])
                (0xc2b40000,inPainter,uVar6 & 0xffffffff,
                 (ulong)(uint)(((int)local_68 + (int)lVar5) -
                              (int)((ulong)((lVar5 - iVar3) - (lVar5 - iVar3 >> 0x3f)) >> 1)),
                 local_b0);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    bVar4 = true;
LAB_00106acd:
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool PPlot::DrawYAxis (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mYAxisSetup.mStyle);
      float theX1;
      PRect theRect = inRect;
      float theTargetX = 0;
      if (!mYAxisSetup.mCrossOrigin) {
        if (mXAxisSetup.mAscending) {
          theTargetX = mXAxisSetup.mMin;
        }
        else {
          theTargetX = mXAxisSetup.mMax;
        }
      }
      theX1 = mXTrafo->Transform (theTargetX);

      int theY1 = inRect.mY;
      float theX2 = theX1;
      int theY2 = theY1+theRect.mH;

      // draw y axis
      inPainter.DrawLine (theX1, theY1, theX2, theY2);

      // ticks
      inPainter.SetStyle (mYAxisSetup.mTickInfo.mStyle);
      if (!mYTickIterator->Init ()) {
        return false;
      }

      float theY;
      bool theIsMajorTick;
      string theFormatString;
      PRect theTickRect;

      if (mYAxisSetup.mTickInfo.mTicksOn) {
          while (mYTickIterator->GetNextTick (theY, theIsMajorTick, theFormatString)) {
              if (!DrawYTick (theY, theX1, theIsMajorTick, theFormatString, inPainter, theTickRect)) {
                  return false;
              }

              if (theTickRect.mX < theRect.mX) {
                  theRect.mX = theTickRect.mX;
              }
          }
      }
      
      // draw label
      inPainter.SetStyle (mYAxisSetup.mStyle);
      string theLabel = mYAxisSetup.mLabel;
      if (theLabel.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theLabel.c_str ());
        int theX = theRect.mX;
        int theY = theRect.mY + theRect.mH - (theRect.mH-theW)/2;
        inPainter.DrawRotatedText (theX, theY, -90, theLabel.c_str ());
      }

      return true;
    }